

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O2

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  QBrush *mask;
  long in_FS_OFFSET;
  qreal opacity;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        opacityChanged((QGraphicsOpacityEffect *)_o,*_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        opacityMaskChanged((QGraphicsOpacityEffect *)_o,(QBrush *)_a[1]);
        return;
      }
      break;
    case 2:
      opacity = *_a[1];
LAB_00375db2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setOpacity((QGraphicsOpacityEffect *)_o,opacity);
        return;
      }
      break;
    case 3:
      mask = (QBrush *)_a[1];
LAB_00375dd5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setOpacityMask((QGraphicsOpacityEffect *)_o,mask);
        return;
      }
      break;
    default:
      goto switchD_00375ca2_caseD_3;
    }
    goto LAB_00375e17;
  case ReadProperty:
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      opacityMask((QGraphicsOpacityEffect *)&local_20);
      uVar2 = *puVar1;
      *puVar1 = local_20;
      local_20 = uVar2;
      QBrush::~QBrush((QBrush *)&local_20);
    }
    else if (_id == 0) {
      *puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0xa8);
    }
    break;
  case WriteProperty:
    mask = (QBrush *)*_a;
    if (_id == 1) goto LAB_00375dd5;
    if (_id == 0) {
      opacity = *(qreal *)mask;
      goto LAB_00375db2;
    }
    break;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsOpacityEffect::*)(double)>
                      ((QtMocHelpers *)_a,(void **)opacityChanged,0,0);
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QGraphicsOpacityEffect::*)(QBrush_const&)>
                  ((QtMocHelpers *)_a,(void **)opacityMaskChanged,0,1);
        return;
      }
      goto LAB_00375e17;
    }
  }
switchD_00375ca2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00375e17:
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsOpacityEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->opacityChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->opacityMaskChanged((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        case 2: _t->setOpacity((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setOpacityMask((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(qreal )>(_a, &QGraphicsOpacityEffect::opacityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(const QBrush & )>(_a, &QGraphicsOpacityEffect::opacityMaskChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->opacityMask(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setOpacityMask(*reinterpret_cast<QBrush*>(_v)); break;
        default: break;
        }
    }
}